

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogFile.cpp
# Opt level: O3

void __thiscall liblogger::LogFile::LogFile(LogFile *this,string *fname)

{
  pointer pcVar1;
  FILE *pFVar2;
  ostream *poVar3;
  int *piVar4;
  char *pcVar5;
  LogException *this_00;
  stringstream ss;
  string local_1d0;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  (this->super_ILogger)._vptr_ILogger = (_func_int **)&PTR__LogFile_00144078;
  (this->m_fname)._M_dataplus._M_p = (pointer)&(this->m_fname).field_2;
  pcVar1 = (fname->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_fname,pcVar1,pcVar1 + fname->_M_string_length);
  pFVar2 = fopen((this->m_fname)._M_dataplus._M_p,"a");
  this->m_fp = (FILE *)pFVar2;
  if (pFVar2 != (FILE *)0x0) {
    return;
  }
  std::__cxx11::stringstream::stringstream(local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"Cannot open file: \'",0x13);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a0,(this->m_fname)._M_dataplus._M_p,(this->m_fname)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\' error: ",9);
  piVar4 = __errno_location();
  pcVar5 = strerror(*piVar4);
  std::operator<<(poVar3,pcVar5);
  this_00 = (LogException *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  LogException::LogException(this_00,&local_1d0);
  __cxa_throw(this_00,&LogException::typeinfo,LogException::~LogException);
}

Assistant:

LogFile::LogFile(const std::string &fname) :
	m_fname(fname)
{
	m_fp = fopen(m_fname.c_str(), "a");
	if (m_fp == NULL)
	{
		std::stringstream ss;
		ss << "Cannot open file: '" << m_fname << "' error: " << strerror(errno);
		throw(LogException(ss.str()));
	}
}